

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

istream * Json::operator>>(istream *sin,Value *root)

{
  FILE *__stream;
  bool bVar1;
  runtime_error *this;
  string local_148;
  Reader reader;
  
  Reader::Reader(&reader);
  bVar1 = Reader::parse(&reader,sin,root,true);
  __stream = _stderr;
  if (bVar1) {
    Reader::~Reader(&reader);
    return sin;
  }
  Reader::getFormattedErrorMessages_abi_cxx11_(&local_148,&reader);
  fprintf(__stream,"Error from reader: %s",local_148._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_148);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"reader error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::istream& operator>>(std::istream& sin, Value& root) {
  Json::Reader reader;
  bool ok = reader.parse(sin, root, true);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            reader.getFormattedErrorMessages().c_str());

    JSON_FAIL_MESSAGE("reader error");
  }
  return sin;
}